

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::iterate(DrawInvalidRangeCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  int iVar1;
  GLuint index;
  GLenum GVar2;
  GLuint start;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  ulong uVar4;
  GLuint end;
  CallLogWrapper gl;
  deInt64 indexLimit;
  Surface dst;
  VertexArray vao;
  CallLogWrapper local_200;
  ulong local_1e8;
  Surface local_1e0;
  Enum<int,_2UL> local_1c8;
  ObjectWrapper local_1b8;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_200,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  index = glu::CallLogWrapper::glGetAttribLocation
                    (&local_200,(this->m_program->m_program).m_program,"a_position");
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::Surface::Surface(&local_1e0,iVar1,pRVar3->m_height);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1b8,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_1e8 = 0;
  start = this->m_min;
  end = this->m_max;
  local_200.m_enableLog = true;
  if ((this->m_useLimitMin != false) || (this->m_useLimitMax == true)) {
    glu::CallLogWrapper::glGetInteger64v(&local_200,0x8d6b,(GLint64 *)&local_1e8);
    GVar2 = glu::CallLogWrapper::glGetError(&local_200);
    glu::checkError(GVar2,"query limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                    ,0xa9);
  }
  if (this->m_useLimitMin == true) {
    start = 0xfffffff0;
    if (local_1e8 >> 0x20 == 0) {
      start = (int)local_1e8 - 0x10;
    }
  }
  uVar4 = 0xffffffff;
  if (local_1e8 < 0xffffffff) {
    uVar4 = local_1e8;
  }
  if (this->m_useLimitMax != false) {
    end = (GLuint)uVar4;
  }
  glu::CallLogWrapper::glClearColor(&local_200,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&local_200,0x4000);
  GVar2 = glu::CallLogWrapper::glGetError(&local_200);
  glu::checkError(GVar2,"setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xbe);
  glu::CallLogWrapper::glUseProgram(&local_200,(this->m_program->m_program).m_program);
  GVar2 = glu::CallLogWrapper::glGetError(&local_200);
  glu::checkError(GVar2,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc1);
  glu::CallLogWrapper::glBindVertexArray(&local_200,local_1b8.m_object);
  glu::CallLogWrapper::glBindBuffer(&local_200,0x8893,this->m_indexBuffer);
  glu::CallLogWrapper::glBindBuffer(&local_200,0x8892,this->m_buffer);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_200,index);
  glu::CallLogWrapper::glVertexAttribPointer(&local_200,index,4,0x1406,'\0',0,(void *)0x0);
  GVar2 = glu::CallLogWrapper::glGetError(&local_200);
  glu::checkError(GVar2,"set buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc9);
  glu::CallLogWrapper::glDrawRangeElements
            (&local_200,0,start,end,this->m_numIndices,0x1405,(void *)0x0);
  GVar2 = glu::CallLogWrapper::glGetError(&local_200);
  if (GVar2 != 0) {
    local_1a0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Got error: ",0xb);
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ignoring...",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_128);
  }
  glu::CallLogWrapper::glFinish(&local_200);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1c8.m_getName = (GetNameFunc)0x300000008;
  if ((void *)local_1e0.m_pixels.m_cap != (void *)0x0) {
    local_1e0.m_pixels.m_cap = (size_t)local_1e0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1a0,(TextureFormat *)&local_1c8,local_1e0.m_width,
             local_1e0.m_height,1,(void *)local_1e0.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a0);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ObjectWrapper::~ObjectWrapper(&local_1b8);
  tcu::Surface::~Surface(&local_1e0);
  glu::CallLogWrapper::~CallLogWrapper(&local_200);
  return STOP;
}

Assistant:

DrawInvalidRangeCase::IterateResult DrawInvalidRangeCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const deInt32			positionLoc = gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			dst			(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	glu::VertexArray		vao			(m_context.getRenderContext());

	deInt64					indexLimit	= 0;
	deUint32				min			= m_min;
	deUint32				max			= m_max;

	gl.enableLogging(true);

	if (m_useLimitMin || m_useLimitMax)
	{
		gl.glGetInteger64v(GL_MAX_ELEMENT_INDEX, &indexLimit);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query limit");
	}

	if (m_useLimitMin)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			min = 0xFFFFFFF0;
		else
			min = (deUint32)(indexLimit - 16);
	}

	if (m_useLimitMax)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			max = 0xFFFFFFFF;
		else
			max = (deUint32)indexLimit;
	}

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	gl.glBindVertexArray(*vao);
	gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);

	gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set buffer");

	gl.glDrawRangeElements(GL_POINTS, min, max, m_numIndices, GL_UNSIGNED_INT, DE_NULL);

	// Indexing outside range is an error, but it doesnt need to be checked. Causes implementation-dependent behavior.
	// Even if the indices are in range (m_min = 0), the specification allows partial processing of vertices in the range,
	// which might cause access over buffer bounds. Causes implementation-dependent behavior.

	// allow errors
	{
		const deUint32 error = gl.glGetError();

		if (error != GL_NO_ERROR)
			m_testCtx.getLog() << tcu::TestLog::Message << "Got error: " << glu::getErrorStr(error) << ", ignoring..." << tcu::TestLog::EndMessage;
	}

	// read pixels to wait for rendering
	gl.glFinish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}